

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::ICUDataTable::get
          (ICUDataTable *this,char *tableKey,char *subTableKey,char *itemKey,UnicodeString *result)

{
  char *path;
  UnicodeString *this_00;
  UBool UVar1;
  char *locale;
  UnicodeString local_88;
  char16_t *local_48;
  UChar *s;
  int32_t len;
  UErrorCode status;
  UnicodeString *result_local;
  char *itemKey_local;
  char *subTableKey_local;
  char *tableKey_local;
  ICUDataTable *this_local;
  
  s._4_4_ = U_ZERO_ERROR;
  s._0_4_ = 0;
  path = this->path;
  _len = result;
  result_local = (UnicodeString *)itemKey;
  itemKey_local = subTableKey;
  subTableKey_local = tableKey;
  tableKey_local = (char *)this;
  locale = Locale::getName(&this->locale);
  local_48 = uloc_getTableStringWithFallback_63
                       (path,locale,subTableKey_local,itemKey_local,(char *)result_local,
                        (int32_t *)&s,(UErrorCode *)((long)&s + 4));
  UVar1 = ::U_SUCCESS(s._4_4_);
  this_00 = _len;
  if ((UVar1 == '\0') || ((int)s < 1)) {
    UnicodeString::UnicodeString(&local_88,(char *)result_local,-1,kInvariant);
    this_local = (ICUDataTable *)UnicodeString::setTo(this_00,&local_88);
    UnicodeString::~UnicodeString(&local_88);
  }
  else {
    this_local = (ICUDataTable *)UnicodeString::setTo(_len,local_48,(int)s);
  }
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString &
ICUDataTable::get(const char* tableKey, const char* subTableKey, const char* itemKey,
                  UnicodeString &result) const {
  UErrorCode status = U_ZERO_ERROR;
  int32_t len = 0;

  const UChar *s = uloc_getTableStringWithFallback(path, locale.getName(),
                                                   tableKey, subTableKey, itemKey,
                                                   &len, &status);
  if (U_SUCCESS(status) && len > 0) {
    return result.setTo(s, len);
  }
  return result.setTo(UnicodeString(itemKey, -1, US_INV));
}